

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_requires_argument_exception::option_requires_argument_exception
          (option_requires_argument_exception *this,string *option)

{
  OptionParseException *in_RDI;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  __lhs = &local_50;
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(__lhs,(char *)in_RDI);
  OptionParseException::OptionParseException(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&in_RDI->super_OptionException = &PTR__option_requires_argument_exception_00242310
  ;
  return;
}

Assistant:

option_requires_argument_exception(const std::string& option)
    : OptionParseException(u8"Option ‘" + option + u8"’ requires an argument")
    {
    }